

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t b_update(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  ion_bpp_err_t iVar1;
  int iVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_address_t iVar4;
  ion_bpp_buffer_t *buf;
  int iVar5;
  ion_bpp_key_t *mkey;
  ion_bpp_buffer_t *cbuf;
  void *local_60;
  ion_bpp_buffer_t *tmp [4];
  
  local_60 = key;
  if (*(int *)((long)handle + 0xb8) * 3 == (uint)(**(ushort **)((long)handle + 0x38) >> 1)) {
    gatherRoot(handle);
    iVar1 = scatter(handle,(ion_bpp_buffer_t *)((long)handle + 0x20),
                    (ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,tmp);
    if (iVar1 != bErrOk) {
      return iVar1;
    }
  }
  iVar5 = 0;
  iVar1 = bErrKeyNotFound;
  buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  do {
    if ((undefined1  [40])((undefined1  [40])*buf->p & (undefined1  [40])0x1) !=
        (undefined1  [40])0x0) {
      if (maxHeight < iVar5) {
        maxHeight = iVar5;
      }
      iVar5 = search(handle,buf,local_60,rec,&mkey,MODE_MATCH);
      if ((iVar5 != -1) && (iVar5 != 1)) {
        *(ion_bpp_external_address_t *)(mkey + *(int *)((long)handle + 8)) = rec;
        iVar1 = bErrOk;
      }
      return iVar1;
    }
    iVar2 = search(handle,buf,local_60,rec,&mkey,MODE_MATCH);
    if (iVar2 < 0) {
      iVar4 = *(ion_bpp_address_t *)(mkey + -8);
    }
    else {
      iVar4 = *(ion_bpp_address_t *)(mkey + (long)*(int *)((long)handle + 8) + 8);
    }
    iVar3 = readDisk(handle,iVar4,&cbuf);
    if (iVar3 != bErrOk) {
      return iVar3;
    }
    if (*(uint *)((long)handle + 0xb8) == (uint)(*(ushort *)cbuf->p >> 1)) {
      iVar3 = gather(handle,buf,&mkey,tmp);
      if (iVar3 != bErrOk) {
        return iVar3;
      }
      iVar3 = scatter(handle,buf,mkey,3,tmp);
      if (iVar3 != bErrOk) {
        return iVar3;
      }
      iVar2 = search(handle,buf,local_60,rec,&mkey,MODE_MATCH);
      if (iVar2 < 0) {
        iVar4 = *(ion_bpp_address_t *)(mkey + -8);
      }
      else {
        iVar4 = *(ion_bpp_address_t *)(mkey + (long)*(int *)((long)handle + 8) + 8);
      }
      iVar3 = readDisk(handle,iVar4,&cbuf);
      if (iVar3 != bErrOk) {
        return iVar3;
      }
    }
    iVar5 = iVar5 + 1;
    buf = cbuf;
  } while( true );
}

Assistant:

ion_bpp_err_t
b_update(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;	/* match key */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root = &h->root;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to update point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */
					return bErrKeyNotFound;
					break;

				case ION_CC_EQ:	/* key = mkey */
					break;

				case ION_CC_GT:	/* key > mkey */
					return bErrKeyNotFound;
					break;
			}

			/* update key */
			rec(mkey) = rec;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}